

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_xor.c
# Opt level: O0

_Bool run_bitset_container_xor(run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  bitset_container_t *pbVar4;
  array_container_t *paVar5;
  undefined8 *in_RDX;
  int *in_RDI;
  rle16_t rle;
  int32_t rlepos;
  bitset_container_t *result;
  bitset_container_t *in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffd0;
  ushort in_stack_ffffffffffffffd2;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar6;
  
  pbVar4 = bitset_container_create();
  bitset_container_copy
            ((bitset_container_t *)
             CONCAT44(in_stack_ffffffffffffffd4,
                      CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)),
             in_stack_ffffffffffffffc8);
  for (iVar6 = 0; iVar6 < *in_RDI; iVar6 = iVar6 + 1) {
    uVar1 = *(uint *)(*(long *)(in_RDI + 2) + (long)iVar6 * 4);
    in_stack_ffffffffffffffd0 = (undefined2)uVar1;
    in_stack_ffffffffffffffd2 = (ushort)(uVar1 >> 0x10);
    bitset_flip_range(pbVar4->words,uVar1 & 0xffff,
                      (uVar1 & 0xffff) + (uint)in_stack_ffffffffffffffd2 + 1);
  }
  iVar3 = bitset_container_compute_cardinality(in_stack_ffffffffffffffc8);
  pbVar4->cardinality = iVar3;
  bVar2 = 0x1000 < pbVar4->cardinality;
  if (bVar2) {
    *in_RDX = pbVar4;
  }
  else {
    paVar5 = array_container_from_bitset
                       ((bitset_container_t *)
                        CONCAT44(iVar6,CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)
                                ));
    *in_RDX = paVar5;
    bitset_container_free((bitset_container_t *)0x1675e4);
  }
  return bVar2;
}

Assistant:

bool run_bitset_container_xor(const run_container_t *src_1,
                              const bitset_container_t *src_2,
                              container_t **dst) {
    bitset_container_t *result = bitset_container_create();

    bitset_container_copy(src_2, result);
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        bitset_flip_range(result->words, rle.value,
                          rle.value + rle.length + UINT32_C(1));
    }
    result->cardinality = bitset_container_compute_cardinality(result);

    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;  // not bitset
    }
    *dst = result;
    return true;  // bitset
}